

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  RegexPattern *this;
  int iVar3;
  undefined6 in_register_0000003a;
  char16_t *form;
  undefined1 local_1028 [8];
  DebugWriter w;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,op);
  if (0x16d < iVar3) {
    if (iVar3 != 0x21c) {
      if (iVar3 == 0x185) {
        uVar1 = data->R0;
        uVar2 = data->C1;
        form = L" R%u = [%u] ";
        goto LAB_007ee6d0;
      }
      if (iVar3 != 0x16e) goto LAB_007ee738;
    }
    uVar1 = data->R0;
    uVar2 = data->C1;
    form = L" R%u[%u]";
LAB_007ee6d0:
    Output::Print(form,(ulong)uVar1,(ulong)uVar2);
    return;
  }
  if (iVar3 == 0xe2) {
    Output::Print(L" R%d ",(ulong)data->R0);
    Output::Print(L"=");
    UnifiedRegex::DebugWriter::DebugWriter((DebugWriter *)local_1028);
    this = FunctionBody::GetLiteralRegex(dumpFunction,data->C1);
    UnifiedRegex::RegexPattern::Print(this,(DebugWriter *)local_1028);
    return;
  }
  if (iVar3 == 0xe4) {
    Output::Print(L" R%d ",(ulong)data->R0);
    goto LAB_007ee756;
  }
LAB_007ee738:
  Output::Print(L" R%d ",(ulong)data->R0);
  Output::Print(L"=");
LAB_007ee756:
  Output::Print(L" uint:%u ",(ulong)data->C1);
  return;
}

Assistant:

void ByteCodeDumper::DumpReg1Unsigned1(OpCode op, const unaligned T* data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::InvalCachedScope:
#if ENABLE_NATIVE_CODEGEN
            case OpCode::NewScopeSlots:
#endif
                Output::Print(_u(" R%u[%u]"), data->R0, data->C1);
                break;
            case OpCode::NewRegEx:
            {
                DumpReg(data->R0);
#if DBG
                Output::Print(_u("="));
                UnifiedRegex::DebugWriter w;
                dumpFunction->GetLiteralRegex(data->C1)->Print(&w);
#else
                Output::Print(_u("=<regex>"));
#endif
                break;
            }
            case OpCode::InitForInEnumerator:
            {
                DumpReg(data->R0);
                DumpU4(data->C1);
                break;
            }
            case OpCode::NewPropIdArrForCompProps:
            {
                Output::Print(_u(" R%u = [%u] "), data->R0, data->C1);
                break;
            }
            default:
                DumpReg(data->R0);
                Output::Print(_u("="));
                DumpU4(data->C1);
                break;
        };
    }